

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.hpp
# Opt level: O0

bool __thiscall
Inferences::ALASCA::VariableElimination::
FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_>::isOneSideBounded
          (FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *this)

{
  size_t sVar1;
  long in_RDI;
  bool local_12;
  
  sVar1 = Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  *)(in_RDI + 0x10));
  if ((((sVar1 != 0) &&
       (sVar1 = Lib::
                Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                        *)(in_RDI + 0x30)), sVar1 == 0)) &&
      (sVar1 = Lib::
               Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
               ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                       *)(in_RDI + 0x50)), sVar1 == 0)) &&
     (sVar1 = Lib::
              Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                      *)(in_RDI + 0x70)), sVar1 == 0)) {
    return true;
  }
  sVar1 = Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  *)(in_RDI + 0x10));
  local_12 = false;
  if (sVar1 == 0) {
    sVar1 = Lib::
            Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
            ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    *)(in_RDI + 0x30));
    local_12 = false;
    if (sVar1 != 0) {
      sVar1 = Lib::
              Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                      *)(in_RDI + 0x50));
      local_12 = false;
      if (sVar1 == 0) {
        sVar1 = Lib::
                Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                ::size((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                        *)(in_RDI + 0x70));
        local_12 = sVar1 == 0;
      }
    }
  }
  return local_12;
}

Assistant:

bool isOneSideBounded() const
    {
      return (this->posIneq.size() != 0 && this->negIneq.size() == 0 && this->eq.size() == 0 && this->neq.size() == 0)
          || (this->posIneq.size() == 0 && this->negIneq.size() != 0 && this->eq.size() == 0 && this->neq.size() == 0); }